

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upper_bound_suite.cpp
# Opt level: O0

void find_array(void)

{
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_9a0;
  undefined4 local_994;
  iterator local_990;
  iterator local_978;
  difference_type local_960 [2];
  iterator local_950;
  iterator local_938;
  undefined1 local_920 [8];
  iterator where_13;
  iterator local_900;
  iterator local_8e8;
  difference_type local_8d0 [2];
  iterator local_8c0;
  iterator local_8a8;
  undefined1 local_890 [8];
  iterator where_12;
  iterator local_870;
  iterator local_858;
  difference_type local_840 [2];
  iterator local_830;
  iterator local_818;
  undefined1 local_800 [8];
  iterator where_11;
  iterator local_7e0;
  iterator local_7c8;
  difference_type local_7b0 [2];
  iterator local_7a0;
  iterator local_788;
  undefined1 local_770 [8];
  iterator where_10;
  iterator local_750;
  iterator local_738;
  difference_type local_720 [2];
  iterator local_710;
  iterator local_6f8;
  undefined1 local_6e0 [8];
  iterator where_9;
  iterator local_6c0;
  iterator local_6a8;
  difference_type local_690 [2];
  iterator local_680;
  iterator local_668;
  undefined1 local_650 [8];
  iterator where_8;
  iterator local_630;
  iterator local_618;
  difference_type local_600 [2];
  iterator local_5f0;
  iterator local_5d8;
  undefined1 local_5c0 [8];
  iterator where_7;
  iterator local_5a0;
  iterator local_588;
  difference_type local_570 [2];
  iterator local_560;
  iterator local_548;
  undefined1 local_530 [8];
  iterator where_6;
  iterator local_510;
  iterator local_4f8;
  difference_type local_4e0 [2];
  iterator local_4d0;
  iterator local_4b8;
  undefined1 local_4a0 [8];
  iterator where_5;
  iterator local_480;
  iterator local_468;
  difference_type local_450;
  int local_444;
  iterator local_440;
  iterator local_428;
  undefined1 local_410 [8];
  iterator where_4;
  iterator local_3f0;
  iterator local_3d8;
  difference_type local_3c0 [2];
  double local_3b0;
  iterator local_3a8;
  iterator local_390;
  undefined1 local_378 [8];
  iterator where_3;
  iterator local_358;
  iterator local_340;
  difference_type local_328;
  int local_31c;
  iterator local_318;
  iterator local_300;
  undefined1 local_2e8 [8];
  iterator where_2;
  iterator local_2c8;
  iterator local_2b0;
  difference_type local_298;
  bool local_289;
  iterator local_288;
  iterator local_270;
  undefined1 local_258 [8];
  iterator where_1;
  iterator local_238;
  iterator local_220;
  difference_type local_208;
  int local_1fc;
  iterator local_1f8;
  iterator local_1e0;
  undefined1 local_1c8 [8];
  iterator where;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_198,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_168,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_138,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_108,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a8,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,L"delta");
  local_48._0_8_ = &local_198;
  local_48._8_8_ = 7;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_9a0 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_9a0 = local_9a0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_9a0);
  } while (local_9a0 != &local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1e0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1f8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_1fc = 0;
  std::upper_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,int>
            ((iterator *)local_1c8,&local_1e0,&local_1f8,&local_1fc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_220,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_238,(iterator *)local_1c8);
  local_208 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_220,&local_238);
  where_1.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/upper_bound_suite.cpp"
             ,0x142,"void find_array()",&local_208,
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_220);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_270,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_288,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_289 = true;
  std::upper_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,bool>
            ((iterator *)local_258,&local_270,&local_288,&local_289);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_288);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_270);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2b0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_2c8,(iterator *)local_258);
  local_298 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_2b0,&local_2c8);
  where_2.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/upper_bound_suite.cpp"
             ,0x146,"void find_array()",&local_298,
             &where_2.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_300,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_318,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_31c = 2;
  std::upper_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,int>
            ((iterator *)local_2e8,&local_300,&local_318,&local_31c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_300);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_340,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_358,(iterator *)local_2e8);
  local_328 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_340,&local_358);
  where_3.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/upper_bound_suite.cpp"
             ,0x14a,"void find_array()",&local_328,
             &where_3.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_340);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_390,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_3a8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_3b0 = 3.0;
  std::upper_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,double>
            ((iterator *)local_378,&local_390,&local_3a8,&local_3b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_390);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3d8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_3f0,(iterator *)local_378);
  local_3c0[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_3d8,&local_3f0);
  where_4.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/upper_bound_suite.cpp"
             ,0x14e,"void find_array()",local_3c0,
             &where_4.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_378);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_428,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_440,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_444 = 4;
  std::upper_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,int>
            ((iterator *)local_410,&local_428,&local_440,&local_444);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_440);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_428);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_468,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_480,(iterator *)local_410);
  local_450 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_468,&local_480);
  where_5.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/upper_bound_suite.cpp"
             ,0x152,"void find_array()",&local_450,
             &where_5.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_480);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_468);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_410);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_4b8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_4d0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::upper_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char[6]>
            ((iterator *)local_4a0,&local_4b8,&local_4d0,(char (*) [6])"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_4f8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_510,(iterator *)local_4a0);
  local_4e0[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_4f8,&local_510);
  where_6.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/upper_bound_suite.cpp"
             ,0x156,"void find_array()",local_4e0,
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_510);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_4a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_548,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_560,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::upper_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char[6]>
            ((iterator *)local_530,&local_548,&local_560,(char (*) [6])"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_560);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_548);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_588,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_5a0,(iterator *)local_530);
  local_570[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_588,&local_5a0);
  where_7.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/upper_bound_suite.cpp"
             ,0x15a,"void find_array()",local_570,
             &where_7.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_588);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_530);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5d8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_5f0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::upper_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,wchar_t[6]>
            ((iterator *)local_5c0,&local_5d8,&local_5f0,(wchar_t (*) [6])L"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_618,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_630,(iterator *)local_5c0);
  local_600[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_618,&local_630);
  where_8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/upper_bound_suite.cpp"
             ,0x15e,"void find_array()",local_600,
             &where_8.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_630);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_618);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_5c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_668,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_680,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::upper_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,wchar_t[6]>
            ((iterator *)local_650,&local_668,&local_680,(wchar_t (*) [6])L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_680);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_668);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_6a8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_6c0,(iterator *)local_650);
  local_690[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_6a8,&local_6c0);
  where_9.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/upper_bound_suite.cpp"
             ,0x162,"void find_array()",local_690,
             &where_9.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_650);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_6f8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_710,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::upper_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,wchar_t[8]>
            ((iterator *)local_6e0,&local_6f8,&local_710,(wchar_t (*) [8])L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_710);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_738,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_750,(iterator *)local_6e0);
  local_720[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_738,&local_750);
  where_10.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/upper_bound_suite.cpp"
             ,0x166,"void find_array()",local_720,
             &where_10.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_750);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_738);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_6e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_788,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_7a0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::upper_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char16_t[6]>
            ((iterator *)local_770,&local_788,&local_7a0,(char16_t (*) [6])L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_7a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_788);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_7c8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_7e0,(iterator *)local_770);
  local_7b0[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_7c8,&local_7e0);
  where_11.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/upper_bound_suite.cpp"
             ,0x16a,"void find_array()",local_7b0,
             &where_11.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_7e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_7c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_770);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_818,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_830,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::upper_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char16_t[8]>
            ((iterator *)local_800,&local_818,&local_830,(char16_t (*) [8])L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_830);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_818);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_858,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_870,(iterator *)local_800);
  local_840[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_858,&local_870);
  where_12.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 6;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","6",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/upper_bound_suite.cpp"
             ,0x16e,"void find_array()",local_840,
             &where_12.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_870);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_858);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_800);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_8a8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_8c0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::upper_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char32_t[8]>
            ((iterator *)local_890,&local_8a8,&local_8c0,(char32_t (*) [8])L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_8e8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_900,(iterator *)local_890);
  local_8d0[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_8e8,&local_900);
  where_13.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 6;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","6",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/upper_bound_suite.cpp"
             ,0x172,"void find_array()",local_8d0,
             &where_13.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_900);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_890);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_938,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_950,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::upper_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char32_t[6]>
            ((iterator *)local_920,&local_938,&local_950,(char32_t (*) [6])L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_950);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_938);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_978,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_990,(iterator *)local_920);
  local_960[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_978,&local_990);
  local_994 = 7;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","7",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/upper_bound_suite.cpp"
             ,0x176,"void find_array()",local_960,&local_994);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_990);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_978);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_920);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void find_array()
{
    variable data = array::make({true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta"});
    {
        auto where = std::upper_bound(data.begin(), data.end(), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    {
        auto where = std::upper_bound(data.begin(), data.end(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
    }
    {
        auto where = std::upper_bound(data.begin(), data.end(), 2);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 2);
    }
    {
        auto where = std::upper_bound(data.begin(), data.end(), 3.0);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 3);
    }
    {
        auto where = std::upper_bound(data.begin(), data.end(), 4);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 3);
    }
    {
        auto where = std::upper_bound(data.begin(), data.end(), "alpha");
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 4);
    }
    {
        auto where = std::upper_bound(data.begin(), data.end(), "bravo");
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 4);
    }
    {
        auto where = std::upper_bound(data.begin(), data.end(), L"alpha");
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 4);
    }
    {
        auto where = std::upper_bound(data.begin(), data.end(), L"bravo");
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 5);
    }
    {
        auto where = std::upper_bound(data.begin(), data.end(), L"charlie");
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 5);
    }
    {
        auto where = std::upper_bound(data.begin(), data.end(), u"bravo");
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 5);
    }
    {
        auto where = std::upper_bound(data.begin(), data.end(), u"charlie");
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 6);
    }
    {
        auto where = std::upper_bound(data.begin(), data.end(), U"charlie");
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 6);
    }
    {
        auto where = std::upper_bound(data.begin(), data.end(), U"delta");
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 7);
    }
}